

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_kv_cursor_key(unqlite_kv_cursor *pCursor,void *pBuf,int *pnByte)

{
  int iVar1;
  SyBlob sBlob;
  SyMemBackend *local_40;
  void *local_38;
  undefined8 uStack_30;
  uint local_28;
  
  if (pBuf == (void *)0x0) {
    iVar1 = (*pCursor->pStore->pIo->pMethods->xKeyLength)(pCursor,pnByte);
    return iVar1;
  }
  if (*pnByte < 0) {
    iVar1 = -0x18;
  }
  else {
    uStack_30 = (ulong)(uint)*pnByte << 0x20;
    local_40 = (SyMemBackend *)0x0;
    local_28 = 3;
    local_38 = pBuf;
    iVar1 = (*pCursor->pStore->pIo->pMethods->xKey)(pCursor,unqliteDataConsumer,&local_40);
    *pnByte = (int)uStack_30;
    if (((local_28 & 6) == 0) && (uStack_30._4_4_ != 0)) {
      SyMemBackendFree(local_40,local_38);
    }
  }
  return iVar1;
}

Assistant:

int unqlite_kv_cursor_key(unqlite_kv_cursor *pCursor,void *pBuf,int *pnByte)
{
	int rc;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	if( pBuf == 0 ){
		/* Key length only */
		rc = pCursor->pStore->pIo->pMethods->xKeyLength(pCursor,pnByte);
	}else{
		SyBlob sBlob;
		if( (*pnByte) < 0 ){
			return UNQLITE_CORRUPT;
		}
		/* Initialize the data consumer */
		SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)(*pnByte));
		/* Consume the key */
		rc = pCursor->pStore->pIo->pMethods->xKey(pCursor,unqliteDataConsumer,&sBlob);
		 /* Key length */
		*pnByte = SyBlobLength(&sBlob);
		/* Cleanup */
		SyBlobRelease(&sBlob);
	}
	return rc;
}